

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::AssertionStack::Print(AssertionStack *this,DebugWriter *w,Matcher *matcher)

{
  bool bVar1;
  AssertionInfo *this_00;
  undefined1 local_30 [8];
  Iterator it;
  Matcher *matcher_local;
  DebugWriter *w_local;
  AssertionStack *this_local;
  
  it.stack = (ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL> *)matcher;
  ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::Iterator
            ((Iterator *)local_30,
             &this->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>);
  while( true ) {
    bVar1 = ContinuousPageStack::Iterator::operator_cast_to_bool((Iterator *)local_30);
    if (!bVar1) break;
    this_00 = ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::
              operator->((Iterator *)local_30);
    AssertionInfo::Print(this_00,w);
    ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::operator++
              ((Iterator *)local_30);
  }
  return;
}

Assistant:

void AssertionStack::Print(DebugWriter* w, const Matcher* matcher) const
    {
        for (Iterator it(*this); it; ++it)
        {
            it->Print(w);
        }
    }